

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,4>,tcu::Vector<float,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,4,4>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  FloatFormat *fmt;
  undefined8 *puVar1;
  _Rb_tree_node_base *p_Var2;
  pointer pVVar3;
  pointer pVVar4;
  Variable<tcu::Vector<float,_4>_> *pVVar5;
  pointer pcVar6;
  Variable<tcu::Matrix<float,_4,_4>_> *pVVar7;
  undefined8 uVar8;
  PrecisionCase *pPVar9;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar10;
  bool bVar11;
  ContextType type;
  int iVar12;
  uint uVar13;
  _Rb_tree_node_base *p_Var14;
  char *__s;
  size_t sVar15;
  long *plVar16;
  ShaderExecutor *pSVar17;
  long lVar18;
  IVal *pIVar19;
  IVal *pIVar20;
  MessageBuilder *pMVar21;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  undefined1 *puVar23;
  Vector<float,_4> *pVVar24;
  long lVar25;
  double dVar26;
  byte bVar27;
  IVal in2;
  IVal reference1;
  FuncSet funcs;
  IVal in3;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  FloatFormat highpFmt;
  ostringstream os;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_538 [8];
  PrecisionCase *local_530;
  string local_528;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_508;
  IVal local_4f9;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4f8;
  size_t local_4f0;
  Statement *local_4e8;
  ulong local_4e0;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [24];
  double local_4b0;
  string local_478;
  double local_458;
  ResultCollector *local_450;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_448;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_418;
  undefined1 local_3e8 [16];
  Interval local_3d8;
  undefined1 local_3b8 [8];
  pointer pVStack_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  VarType local_398 [3];
  ios_base local_348 [8];
  ios_base local_340 [272];
  undefined1 local_230 [56];
  _Alloc_hider local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined1 local_1b8 [8];
  pointer pVStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  double local_198;
  Precision local_190;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_188;
  undefined4 local_180;
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  bVar27 = 0;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_4f0 = (long)pVVar4 - (long)pVVar3 >> 4;
  local_508 = variables;
  local_4f8 = inputs;
  local_4e8 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_418,local_4f0);
  local_1f8._M_p = (pointer)&local_1e8;
  local_230._0_4_ = GLSL_VERSION_300_ES;
  local_230._8_8_ = (pointer)0x0;
  local_230._16_8_ = (pointer)0x0;
  local_230._24_8_ = (pointer)0x0;
  local_230._32_8_ = (pointer)0x0;
  local_230._40_8_ = (pointer)0x0;
  local_230._48_8_ = (pointer)0x0;
  local_1f0 = 0;
  local_1e8._M_local_buf[0] = '\0';
  local_1d8._M_p = (pointer)&local_1c8;
  local_1d0 = 0;
  local_1c8._M_local_buf[0] = '\0';
  local_3d8.m_hi = (this->m_ctx).highpFormat.m_maxValue;
  local_3e8._0_8_ = *(undefined8 *)&(this->m_ctx).highpFormat;
  local_3e8._8_8_ = *(undefined8 *)&(this->m_ctx).highpFormat.m_fractionBits;
  local_3d8._0_8_ = *(undefined8 *)&(this->m_ctx).highpFormat.m_hasInf;
  local_3d8.m_lo = *(double *)&(this->m_ctx).highpFormat.m_exactPrecision;
  local_448._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_448._M_impl.super__Rb_tree_header._M_header;
  local_448._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_448._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_448._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3b8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_448._M_impl.super__Rb_tree_header._M_header._M_right =
       local_448._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_3b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_3b0,"Statement: ",0xb);
  (*local_4e8->_vptr_Statement[2])(local_4e8,(ostringstream *)&pVStack_3b0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_530 = this;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_3b0);
  std::ios_base::~ios_base(local_340);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  p_Var2 = (_Rb_tree_node_base *)(local_4d8 + 8);
  local_4d8._8_4_ = _S_red;
  local_4c8._0_8_ = (_Base_ptr)0x0;
  local_4b0 = 0.0;
  local_4c8._8_8_ = p_Var2;
  local_4c8._16_8_ = p_Var2;
  (*local_4e8->_vptr_Statement[4])(local_4e8,local_4d8);
  if ((_Rb_tree_node_base *)local_4c8._8_8_ != p_Var2) {
    p_Var14 = (_Rb_tree_node_base *)local_4c8._8_8_;
    do {
      (**(code **)(**(long **)(p_Var14 + 1) + 0x30))(*(long **)(p_Var14 + 1),local_1b8);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != p_Var2);
  }
  pPVar9 = local_530;
  if (local_4b0 != 0.0) {
    local_3b8 = (undefined1  [8])((local_530->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_3b0,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_3b0,local_528._M_dataplus._M_p,local_528._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p != &local_528.field_2) {
      operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_3b0);
    std::ios_base::~ios_base(local_340);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"precision ",10);
  __s = glu::getPrecisionName((pPVar9->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_538 + *(long *)((long)local_3b8 + -0x18)) + 0x180);
  }
  else {
    sVar15 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,__s,sVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1b8);
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,
                    CONCAT44(local_1a8._M_allocated_capacity._4_4_,
                             local_1a8._M_allocated_capacity._0_4_) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
  std::ios_base::~ios_base(local_348);
  type.super_ApiType.m_bits = (ApiType)(*((pPVar9->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_230._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_530->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   "#extension ",&local_530->m_extension);
    plVar16 = (long *)std::__cxx11::string::append(local_1b8);
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 == paVar22) {
      local_3a8._M_allocated_capacity = paVar22->_M_allocated_capacity;
      local_3a8._8_8_ = plVar16[3];
      local_3b8 = (undefined1  [8])&local_3a8;
    }
    else {
      local_3a8._M_allocated_capacity = paVar22->_M_allocated_capacity;
      local_3b8 = (undefined1  [8])*plVar16;
    }
    pVStack_3b0 = (pointer)plVar16[1];
    *plVar16 = (long)paVar22;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_3b8);
    if (local_3b8 != (undefined1  [8])&local_3a8) {
      operator_delete((void *)local_3b8,local_3a8._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,
                      CONCAT44(local_1a8._M_allocated_capacity._4_4_,
                               local_1a8._M_allocated_capacity._0_4_) + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_230 + 8),2);
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_3b8,local_530,
             (local_508->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar8 = local_230._8_8_;
  std::__cxx11::string::operator=((string *)(local_230._8_8_ + 0x38),(string *)local_3b8);
  glu::VarType::operator=(&((pointer)(uVar8 + 0x38))->varType,local_398);
  glu::VarType::~VarType(local_398);
  if (local_3b8 != (undefined1  [8])&local_3a8) {
    operator_delete((void *)local_3b8,local_3a8._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_3b8,local_530,
             (local_508->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar8 = local_230._8_8_;
  std::__cxx11::string::operator=((string *)local_230._8_8_,(string *)local_3b8);
  glu::VarType::operator=((VarType *)(uVar8 + 0x20),local_398);
  glu::VarType::~VarType(local_398);
  if (local_3b8 != (undefined1  [8])&local_3a8) {
    operator_delete((void *)local_3b8,local_3a8._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_230 + 0x20),1);
  makeSymbol<tcu::Matrix<float,4,4>>
            ((Symbol *)local_3b8,local_530,
             (local_508->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr);
  uVar8 = local_230._32_8_;
  std::__cxx11::string::operator=((string *)local_230._32_8_,(string *)local_3b8);
  glu::VarType::operator=((VarType *)(uVar8 + 0x20),local_398);
  glu::VarType::~VarType(local_398);
  if (local_3b8 != (undefined1  [8])&local_3a8) {
    operator_delete((void *)local_3b8,local_3a8._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
  pPVar9 = local_530;
  (*local_4e8->_vptr_Statement[2])(local_4e8,local_3b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
  std::ios_base::~ios_base(local_348);
  std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_1b8);
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,
                    CONCAT44(local_1a8._M_allocated_capacity._4_4_,
                             local_1a8._M_allocated_capacity._0_4_) + 1);
  }
  pSVar17 = ShaderExecUtil::createExecutor
                      ((pPVar9->m_ctx).renderContext,(pPVar9->m_ctx).shaderType,
                       (ShaderSpec *)local_230);
  local_3b8 = (undefined1  [8])
              (local_4f8->in0).
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  pVStack_3b0 = (local_4f8->in1).
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_3a8._M_allocated_capacity =
       (size_type)
       (local_4f8->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a8._8_8_ =
       (local_4f8->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1b8 = (undefined1  [8])
              local_418.out0.
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pVStack_1b0 = local_418.out1.
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar17->_vptr_ShaderExecutor[3])
            (pSVar17,((pPVar9->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar12 = (*pSVar17->_vptr_ShaderExecutor[2])(pSVar17);
  if ((char)iVar12 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar17->_vptr_ShaderExecutor[5])(pSVar17);
  (*pSVar17->_vptr_ShaderExecutor[6])(pSVar17,local_4f0,local_3b8,local_1b8);
  fmt = &(pPVar9->m_ctx).floatFormat;
  (*pSVar17->_vptr_ShaderExecutor[1])(pSVar17);
  lVar18 = 8;
  do {
    local_1b8[lVar18 + -8] = 0;
    *(undefined8 *)(local_1b8 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)((long)&pVStack_1b0 + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x68);
  lVar18 = 8;
  do {
    local_1b8[lVar18 + -8] = 0;
    *(undefined8 *)(local_1b8 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)((long)&pVStack_1b0 + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x68);
  lVar18 = 8;
  do {
    *(undefined1 *)((long)&local_4e0 + lVar18) = 0;
    *(undefined8 *)(local_4d8 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_4d8 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x68);
  lVar18 = 8;
  do {
    *(undefined1 *)((long)&local_4e0 + lVar18) = 0;
    *(undefined8 *)(local_4d8 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_4d8 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x68);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_3b8);
  pVVar10 = local_508;
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_448,
             (local_508->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_1b8);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_448,
             (pVVar10->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_4d8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_448,
             (pVVar10->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_528);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_448,
             (pVVar10->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_478);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_448,
             (pVVar10->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr,(IVal *)local_3b8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_448,
             (pVVar10->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_4f9);
  if (pVVar4 == pVVar3) {
LAB_0179f2e0:
    local_3b8 = (undefined1  [8])((local_530->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_3b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_3b0,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_3b0," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_450 = &local_530->m_status;
    local_458 = (double)(local_4f0 + (local_4f0 == 0));
    dVar26 = 0.0;
    local_4e0 = 0;
    do {
      tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_3b8);
      if (((ulong)dVar26 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_530->super_TestCase).super_TestNode.m_testCtx);
      }
      pVVar3 = (local_4f8->in0).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + (long)dVar26;
      local_528._M_dataplus._M_p = *(pointer *)pVVar3->m_data;
      local_528._M_string_length = *(size_type *)(pVVar3->m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_4d8,fmt,(Vector<float,_4> *)&local_528);
      pVVar10 = local_508;
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_1b8,fmt,(IVal *)local_4d8);
      pIVar19 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_448,
                           (pVVar10->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      pMVar21 = (MessageBuilder *)local_1b8;
      for (lVar18 = 0xc; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(TestLog **)pIVar19->m_data = pMVar21->m_log;
        pMVar21 = (MessageBuilder *)((long)pMVar21 + (ulong)bVar27 * -0x10 + 8);
        pIVar19 = (IVal *)((long)pIVar19 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      pVVar3 = (local_4f8->in1).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + (long)dVar26;
      local_528._M_dataplus._M_p = *(pointer *)pVVar3->m_data;
      local_528._M_string_length = *(size_type *)(pVVar3->m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_4d8,fmt,(Vector<float,_4> *)&local_528);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_1b8,fmt,(IVal *)local_4d8);
      pIVar19 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_448,
                           (pVVar10->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      pMVar21 = (MessageBuilder *)local_1b8;
      for (lVar18 = 0xc; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(TestLog **)pIVar19->m_data = pMVar21->m_log;
        pMVar21 = (MessageBuilder *)((long)pMVar21 + (ulong)bVar27 * -0x10 + 8);
        pIVar19 = (IVal *)((long)pIVar19 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_448,
                 (pVVar10->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_448,
                 (pVVar10->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_190 = (local_530->m_ctx).precision;
      local_198 = (pPVar9->m_ctx).floatFormat.m_maxValue;
      local_1b8 = *(undefined1 (*) [8])fmt;
      pVStack_1b0 = *(pointer *)&(pPVar9->m_ctx).floatFormat.m_fractionBits;
      local_1a8._M_allocated_capacity._0_4_ = (pPVar9->m_ctx).floatFormat.m_hasInf;
      local_1a8._M_allocated_capacity._4_4_ = (pPVar9->m_ctx).floatFormat.m_hasNaN;
      local_1a8._8_4_ = *(undefined4 *)&(pPVar9->m_ctx).floatFormat.m_exactPrecision;
      local_1a8._12_4_ = *(undefined4 *)&(pPVar9->m_ctx).floatFormat.field_0x1c;
      local_180 = 0;
      local_188 = &local_448;
      (*local_4e8->_vptr_Statement[3])(local_4e8,(MessageBuilder *)local_1b8);
      pIVar20 = Environment::lookup<tcu::Matrix<float,4,4>>
                          ((Environment *)&local_448,
                           (pVVar10->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)local_1b8,(FloatFormat *)local_3e8,pIVar20);
      puVar23 = local_3b8;
      lVar18 = 0;
      pMVar21 = (MessageBuilder *)local_1b8;
      do {
        lVar25 = 0;
        do {
          *(undefined8 *)(puVar23 + lVar25 + 0x10) =
               *(undefined8 *)
                (&(pMVar21->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
                lVar25);
          puVar1 = (undefined8 *)((long)&pMVar21->m_log + lVar25);
          uVar8 = puVar1[1];
          *(undefined8 *)(puVar23 + lVar25) = *puVar1;
          *(undefined8 *)((long)(puVar23 + lVar25) + 8) = uVar8;
          lVar25 = lVar25 + 0x60;
        } while (lVar25 != 0x180);
        lVar18 = lVar18 + 1;
        puVar23 = puVar23 + 0x18;
        pMVar21 = (MessageBuilder *)
                  &(pMVar21->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      } while (lVar18 != 4);
      bVar11 = contains<tcu::Matrix<float,4,4>>
                         ((IVal *)local_3b8,
                          (Matrix<float,_4,_4> *)
                          ((long)local_418.out0.
                                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (long)dVar26 * 4 * 0x10
                          ));
      local_1b8 = (undefined1  [8])&local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"Shader output 0 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(local_450,bVar11,(string *)local_1b8);
      if (local_1b8 != (undefined1  [8])&local_1a8) {
        operator_delete((void *)local_1b8,
                        CONCAT44(local_1a8._M_allocated_capacity._4_4_,
                                 local_1a8._M_allocated_capacity._0_4_) + 1);
      }
      if (!bVar11) {
        uVar13 = (int)local_4e0 + 1;
        local_4e0 = (ulong)uVar13;
        if ((int)uVar13 < 0x65) {
          local_1b8 = (undefined1  [8])((local_530->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_1b0,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_1b0," sample:\n",9)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_1b0,"\t",1);
          pVVar5 = (local_508->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                   .m_ptr;
          pVVar24 = (Vector<float,_4> *)local_4c8;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_4d8._0_8_ = pVVar24;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4d8,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_1b0,(char *)local_4d8._0_8_,
                     CONCAT44(local_4d8._12_4_,local_4d8._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_1b0," = ",3);
          valueToString<tcu::Vector<float,4>>
                    (&local_528,(BuiltinPrecisionTests *)local_3e8,
                     (FloatFormat *)
                     ((local_4f8->in0).
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar26),pVVar24);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_1b0,local_528._M_dataplus._M_p,local_528._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_1b0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_528._M_dataplus._M_p != &local_528.field_2) {
            operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
          }
          if ((Vector<float,_4> *)local_4d8._0_8_ != (Vector<float,_4> *)local_4c8) {
            operator_delete((void *)local_4d8._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_4c8._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_1b0,"\t",1);
          pVVar5 = (local_508->in1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                   .m_ptr;
          pVVar24 = (Vector<float,_4> *)local_4c8;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_4d8._0_8_ = pVVar24;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4d8,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_1b0,(char *)local_4d8._0_8_,
                     CONCAT44(local_4d8._12_4_,local_4d8._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_1b0," = ",3);
          valueToString<tcu::Vector<float,4>>
                    (&local_528,(BuiltinPrecisionTests *)local_3e8,
                     (FloatFormat *)
                     ((local_4f8->in1).
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar26),pVVar24);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_1b0,local_528._M_dataplus._M_p,local_528._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_1b0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_528._M_dataplus._M_p != &local_528.field_2) {
            operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
          }
          if ((Vector<float,_4> *)local_4d8._0_8_ != (Vector<float,_4> *)local_4c8) {
            operator_delete((void *)local_4d8._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_4c8._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_1b0,"\t",1);
          pVVar7 = (local_508->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                   .m_ptr;
          pIVar20 = (IVal *)local_4c8;
          pcVar6 = (pVVar7->m_name)._M_dataplus._M_p;
          local_4d8._0_8_ = pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4d8,pcVar6,pcVar6 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_1b0,(char *)local_4d8._0_8_,
                     CONCAT44(local_4d8._12_4_,local_4d8._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_1b0," = ",3);
          valueToString<tcu::Matrix<float,4,4>>
                    (&local_528,(BuiltinPrecisionTests *)local_3e8,
                     (FloatFormat *)
                     ((long)local_418.out0.
                            super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + (long)dVar26 * 4 * 0x10),
                     (Matrix<float,_4,_4> *)pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_1b0,local_528._M_dataplus._M_p,local_528._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_1b0,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_1b0,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,4,4>>
                    (&local_478,(BuiltinPrecisionTests *)local_3e8,(FloatFormat *)local_3b8,pIVar20)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_1b0,local_478._M_dataplus._M_p,local_478._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_1b0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_528._M_dataplus._M_p != &local_528.field_2) {
            operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_4d8._0_8_ != (IVal *)local_4c8) {
            operator_delete((void *)local_4d8._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_4c8._0_8_ + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_1b0);
          std::ios_base::~ios_base(local_140);
        }
      }
      dVar26 = (double)((long)dVar26 + 1);
    } while (dVar26 != local_458);
    iVar12 = (int)local_4e0;
    if (iVar12 < 0x65) {
      if (iVar12 == 0) goto LAB_0179f2e0;
    }
    else {
      local_3b8 = (undefined1  [8])((local_530->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_3b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_3b0,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pVStack_3b0,iVar12 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_3b0," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_3b0);
      std::ios_base::~ios_base(local_340);
    }
    local_3b8 = (undefined1  [8])((local_530->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_3b0);
    std::ostream::operator<<((ostringstream *)&pVStack_3b0,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_3b0,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_3b0," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_3b0);
  std::ios_base::~ios_base(local_340);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_p != &local_1c8) {
    operator_delete(local_1d8._M_p,
                    CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_p != &local_1e8) {
    operator_delete(local_1f8._M_p,
                    CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_230 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_230 + 8));
  if (local_418.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_418.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_418.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_418.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418.out0.
         super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_418.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_418.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_418.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}